

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qicon.cpp
# Opt level: O3

void __thiscall QIcon::addFile(QIcon *this,QString *fileName,QSize *size,Mode mode,State state)

{
  undefined1 *puVar1;
  QIconEngine *pQVar2;
  qreal __x;
  double dVar3;
  QBasicAtomicInt *pQVar4;
  long lVar5;
  undefined1 **ppuVar6;
  qsizetype qVar7;
  qsizetype qVar8;
  void *pvVar9;
  char cVar10;
  int iVar11;
  QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_iceLoader>_> *pQVar12;
  Type *pTVar13;
  long *plVar14;
  QPixmapIconEngine *this_00;
  QIconPrivate *pQVar15;
  byte bVar16;
  QArrayData *pQVar17;
  long lVar18;
  long lVar19;
  long in_FS_OFFSET;
  QStringView QVar20;
  QStringView QVar21;
  QLatin1String QVar22;
  QStringView QVar23;
  QFileInfo info;
  qreal sourceDevicePixelRatio;
  QString local_b8;
  QMimeDatabase local_98 [8];
  qreal local_90;
  QArrayData *local_88;
  QArrayData *pQStack_80;
  undefined1 **local_78;
  QVLABase<int> local_68;
  undefined1 *local_50;
  undefined1 *puStack_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if ((fileName->d).size == 0) goto LAB_002710b6;
  detach(this);
  pQVar15 = this->d;
  if (pQVar15 == (QIconPrivate *)0x0) {
    local_b8.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    QFileInfo::QFileInfo((QFileInfo *)&local_b8,(QString *)fileName);
    pQVar12 = (QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_iceLoader>_> *)
              &local_68;
    local_68.super_QVLABaseBase.ptr = &DAT_aaaaaaaaaaaaaaaa;
    local_68.super_QVLABaseBase.a = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_68.super_QVLABaseBase.s = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    QFileInfo::suffix();
    if ((undefined1 **)local_68.super_QVLABaseBase.ptr == (undefined1 **)0x0) {
      QMimeDatabase::QMimeDatabase(local_98);
      QMimeDatabase::mimeTypeForFile(&local_90,local_98,&local_b8,0);
      QMimeType::preferredSuffix();
      qVar8 = local_68.super_QVLABaseBase.s;
      qVar7 = local_68.super_QVLABaseBase.a;
      ppuVar6 = local_78;
      pQVar17 = local_88;
      local_88 = (QArrayData *)local_68.super_QVLABaseBase.a;
      local_68.super_QVLABaseBase.a = (qsizetype)pQVar17;
      local_68.super_QVLABaseBase.s = (qsizetype)pQStack_80;
      pQStack_80 = (QArrayData *)qVar8;
      local_78 = (undefined1 **)local_68.super_QVLABaseBase.ptr;
      local_68.super_QVLABaseBase.ptr = ppuVar6;
      if ((QArrayData *)qVar7 != (QArrayData *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)qVar7)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)qVar7)->_q_value).super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)qVar7)->_q_value).super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate((QArrayData *)qVar7,2,0x10);
        }
      }
      QMimeType::~QMimeType((QMimeType *)&local_90);
      pQVar12 = (QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_iceLoader>_> *)
                local_98;
      QMimeDatabase::~QMimeDatabase((QMimeDatabase *)pQVar12);
      if ((undefined1 **)local_68.super_QVLABaseBase.ptr != (undefined1 **)0x0) goto LAB_00270cda;
LAB_00270d47:
      pQVar15 = (QIconPrivate *)operator_new(0x18);
      this_00 = (QPixmapIconEngine *)operator_new(0x20);
      QPixmapIconEngine::QPixmapIconEngine(this_00);
      bVar16 = 0;
    }
    else {
LAB_00270cda:
      pQVar12 = (QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_iceLoader>_> *)
                QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_iceLoader>_>::
                operator()(pQVar12);
      iVar11 = QFactoryLoader::indexOf((QString *)pQVar12);
      if (iVar11 == -1) goto LAB_00270d47;
      pTVar13 = QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_iceLoader>_>::
                operator()(pQVar12);
      QFactoryLoader::instance((int)pTVar13);
      plVar14 = (long *)QMetaObject::cast((QObject *)&QIconEnginePlugin::staticMetaObject);
      if ((plVar14 == (long *)0x0) ||
         (this_00 = (QPixmapIconEngine *)(**(code **)(*plVar14 + 0x60))(plVar14,fileName),
         this_00 == (QPixmapIconEngine *)0x0)) goto LAB_00270d47;
      iVar11 = (*(this_00->super_QIconEngine)._vptr_QIconEngine[0xd])(this_00);
      bVar16 = (byte)iVar11 ^ 1;
      pQVar15 = (QIconPrivate *)operator_new(0x18);
    }
    pQVar15->engine = &this_00->super_QIconEngine;
    (pQVar15->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i = 1;
    LOCK();
    UNLOCK();
    iVar11 = nextSerialNumCounter()::serial + 1;
    nextSerialNumCounter()::serial = nextSerialNumCounter()::serial + 1;
    pQVar15->serialNum = iVar11;
    pQVar15->detach_no = 0;
    pQVar15->is_mask = false;
    this->d = pQVar15;
    if ((QArrayData *)local_68.super_QVLABaseBase.a != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_68.super_QVLABaseBase.a)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_68.super_QVLABaseBase.a)->_q_value).super___atomic_base<int>.
           _M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_68.super_QVLABaseBase.a)->_q_value).super___atomic_base<int>.
          _M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_68.super_QVLABaseBase.a,2,0x10);
      }
    }
    QFileInfo::~QFileInfo((QFileInfo *)&local_b8);
    if (bVar16 == 0) {
      pQVar15 = this->d;
      goto LAB_00270dcc;
    }
  }
  else {
LAB_00270dcc:
    (*pQVar15->engine->_vptr_QIconEngine[6])(pQVar15->engine,fileName,size,(ulong)mode,(ulong)state)
    ;
  }
  (*this->d->engine->_vptr_QIconEngine[7])(&local_68);
  if ((undefined1 **)local_68.super_QVLABaseBase.ptr == (undefined1 **)0x3) {
    QVar20.m_data = (storage_type_conflict *)local_68.super_QVLABaseBase.s;
    QVar20.m_size = 3;
    QVar22.m_data = "svg";
    QVar22.m_size = 3;
    cVar10 = QtPrivate::equalStrings(QVar20,QVar22);
  }
  else {
    cVar10 = '\0';
  }
  if ((QArrayData *)local_68.super_QVLABaseBase.a != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_68.super_QVLABaseBase.a)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_68.super_QVLABaseBase.a)->_q_value).super___atomic_base<int>.
         _M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_68.super_QVLABaseBase.a)->_q_value).super___atomic_base<int>._M_i
        == 0) {
      QArrayData::deallocate((QArrayData *)local_68.super_QVLABaseBase.a,2,0x10);
    }
  }
  if (cVar10 == '\0') {
    local_68.super_QVLABaseBase.ptr = &local_50;
    local_50 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_48 = &DAT_aaaaaaaaaaaaaaaa;
    local_68.super_QVLABaseBase.a = 4;
    local_68.super_QVLABaseBase.s = 0;
    local_78 = (undefined1 **)&DAT_aaaaaaaaaaaaaaaa;
    local_88 = (QArrayData *)&DAT_aaaaaaaaaaaaaaaa;
    pQStack_80 = (QArrayData *)&DAT_aaaaaaaaaaaaaaaa;
    QGuiApplication::screens();
    if (local_78 != (undefined1 **)0x0) {
      pQVar4 = &pQStack_80->ref_;
      lVar18 = (long)local_78 * 2;
      pQVar17 = pQStack_80;
      do {
        __x = QScreen::devicePixelRatio(*(QScreen **)pQVar17);
        dVar3 = ceil(__x);
        iVar11 = (int)dVar3;
        local_90 = (qreal)CONCAT44(local_90._4_4_,iVar11);
        if (0 < iVar11) {
          lVar19 = local_68.super_QVLABaseBase.s * 4;
          do {
            if (lVar19 == 0) {
              if (local_68.super_QVLABaseBase.s == local_68.super_QVLABaseBase.a) {
                local_b8.d.d = (Data *)CONCAT44(local_b8.d.d._4_4_,iVar11);
                QVLABase<int>::emplace_back_impl<int>(&local_68,4,&local_50,(int *)&local_b8);
              }
              else {
                QVLABase<int>::emplace_back_impl<int_const&>(&local_68,4,&local_50,(int *)&local_90)
                ;
              }
              break;
            }
            lVar5 = lVar19 + -4;
            lVar19 = lVar19 + -4;
          } while (*(int *)((long)local_68.super_QVLABaseBase.ptr + lVar5) != iVar11);
        }
        pQVar17 = (QArrayData *)&pQVar17->alloc;
      } while (pQVar17 != (QArrayData *)(pQVar4 + lVar18));
    }
    pvVar9 = local_68.super_QVLABaseBase.ptr;
    if ((QArrayData *)local_68.super_QVLABaseBase.s != (QArrayData *)0x0) {
      puVar1 = (undefined1 *)
               ((long)local_68.super_QVLABaseBase.ptr + local_68.super_QVLABaseBase.s * 4);
      lVar18 = 0x3f;
      if ((QArrayData *)local_68.super_QVLABaseBase.s != (QArrayData *)0x0) {
        for (; (ulong)local_68.super_QVLABaseBase.s >> lVar18 == 0; lVar18 = lVar18 + -1) {
        }
      }
      std::__introsort_loop<int*,long,__gnu_cxx::__ops::_Iter_comp_iter<std::greater<int>>>
                (local_68.super_QVLABaseBase.ptr,puVar1,((uint)lVar18 ^ 0x3f) * 2 ^ 0x7e);
      std::__final_insertion_sort<int*,__gnu_cxx::__ops::_Iter_comp_iter<std::greater<int>>>
                (pvVar9,puVar1);
      pvVar9 = local_68.super_QVLABaseBase.ptr;
      local_90 = 1.79769313486232e+308;
      if ((QArrayData *)local_68.super_QVLABaseBase.s != (QArrayData *)0x0) {
        lVar19 = local_68.super_QVLABaseBase.s << 2;
        lVar18 = 0;
        do {
          if ((double)*(int *)((long)pvVar9 + lVar18) < local_90) {
            local_b8.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
            local_b8.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
            local_b8.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
            qt_findAtNxFile(&local_b8,fileName,(double)*(int *)((long)pvVar9 + lVar18),&local_90);
            if (((undefined1 *)local_b8.d.size != (undefined1 *)(fileName->d).size) ||
               (QVar21.m_data = local_b8.d.ptr, QVar21.m_size = local_b8.d.size,
               QVar23.m_data = (fileName->d).ptr, QVar23.m_size = local_b8.d.size,
               cVar10 = QtPrivate::equalStrings(QVar21,QVar23), cVar10 == '\0')) {
              pQVar2 = this->d->engine;
              (*pQVar2->_vptr_QIconEngine[6])(pQVar2,&local_b8,size,(ulong)mode,(ulong)state);
            }
            if (&(local_b8.d.d)->super_QArrayData != (QArrayData *)0x0) {
              LOCK();
              ((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                   ((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
                   -1;
              UNLOCK();
              if (((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
                  0) {
                QArrayData::deallocate(&(local_b8.d.d)->super_QArrayData,2,0x10);
              }
            }
          }
          lVar18 = lVar18 + 4;
        } while (lVar19 != lVar18);
      }
    }
    if (local_88 != (QArrayData *)0x0) {
      LOCK();
      (local_88->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_88->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_88->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_88,8,0x10);
      }
    }
    if ((undefined1 **)local_68.super_QVLABaseBase.ptr != &local_50) {
      QtPrivate::sizedFree(local_68.super_QVLABaseBase.ptr,local_68.super_QVLABaseBase.a << 2);
    }
  }
LAB_002710b6:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QIcon::addFile(const QString &fileName, const QSize &size, Mode mode, State state)
{
    if (fileName.isEmpty())
        return;
    detach();
    bool alreadyAdded = false;
    if (!d) {

        QFileInfo info(fileName);
        QString suffix = info.suffix();
#if QT_CONFIG(mimetype)
        if (suffix.isEmpty())
            suffix = QMimeDatabase().mimeTypeForFile(info).preferredSuffix(); // determination from contents
#endif // mimetype
        QIconEngine *engine = iconEngineFromSuffix(fileName, suffix);
        if (engine)
            alreadyAdded = !engine->isNull();
        d = new QIconPrivate(engine ? engine : new QPixmapIconEngine);
    }
    if (!alreadyAdded)
        d->engine->addFile(fileName, size, mode, state);

    if (d->engine->key() == "svg"_L1)   // not needed and also not supported
        return;

    // Check if a "@Nx" file exists and add it.
    QVarLengthArray<int, 4> devicePixelRatios;
    const auto screens = qApp->screens();
    for (const auto *screen : screens) {
        const auto dpr = qCeil(screen->devicePixelRatio()); // qt_findAtNxFile only supports integer values
        if (dpr >= 1 && !devicePixelRatios.contains(dpr))
            devicePixelRatios.push_back(dpr);
    }
    std::sort(devicePixelRatios.begin(), devicePixelRatios.end(), std::greater<int>());
    qreal sourceDevicePixelRatio = std::numeric_limits<qreal>::max();
    for (const auto dpr : std::as_const(devicePixelRatios)) {
        if (dpr >= sourceDevicePixelRatio)
            continue;
        const QString atNxFileName = qt_findAtNxFile(fileName, dpr, &sourceDevicePixelRatio);
        if (atNxFileName != fileName)
            d->engine->addFile(atNxFileName, size, mode, state);
    }
}